

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O0

void __thiscall HighsIis::addRow(HighsIis *this,HighsInt row,HighsInt status)

{
  value_type_conflict2 *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  std::vector<int,_std::allocator<int>_>::push_back(unaff_retaddr,in_RDI);
  std::vector<int,_std::allocator<int>_>::push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void HighsIis::addRow(const HighsInt row, const HighsInt status) {
  this->row_index_.push_back(row);
  this->row_bound_.push_back(status);
}